

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

vector<double> * __thiscall
mat_lib::vector<double>::operator-
          (vector<double> *__return_storage_ptr__,vector<double> *this,vector<double> *rhs)

{
  double dVar1;
  size_t sVar2;
  size_t sVar3;
  logic_error *this_00;
  reference pvVar4;
  element_t eVar5;
  int local_34;
  int i;
  vector<double> *rhs_local;
  vector<double> *this_local;
  vector<double> *res;
  
  sVar2 = size(this);
  sVar3 = size(rhs);
  if (sVar2 == sVar3) {
    sVar2 = size(this);
    vector(__return_storage_ptr__,sVar2);
    for (local_34 = 0; sVar2 = size(rhs), (ulong)(long)local_34 < sVar2; local_34 = local_34 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->container__,(long)local_34);
      dVar1 = *pvVar4;
      eVar5 = operator[](rhs,(long)local_34);
      set(__return_storage_ptr__,(long)local_34,dVar1 - eVar5);
    }
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"bad sum operations");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

vector operator-(const vector &rhs){
          if(this->size() != rhs.size()) throw logic_error("bad sum operations");
          vector<element_t> res(this->size());

          for (int i = 0; i < rhs.size(); ++i) {
              res.set(i,container__[i] - rhs[i]);
          }

          return res;
      }